

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O3

unique_ptr<wabt::SelectExpr,_std::default_delete<wabt::SelectExpr>_> __thiscall
wabt::MakeUnique<wabt::SelectExpr,std::vector<wabt::Type,std::allocator<wabt::Type>>>
          (wabt *this,vector<wabt::Type,_std::allocator<wabt::Type>_> *args)

{
  undefined8 *puVar1;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_38;
  
  puVar1 = (undefined8 *)operator_new(0x58);
  local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (args->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (args->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (args->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)((long)puVar1 + 0x24) = 0;
  *(undefined8 *)((long)puVar1 + 0x2c) = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  *(undefined4 *)(puVar1 + 7) = 0x28;
  *puVar1 = &PTR__SelectExpr_0019da88;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(puVar1 + 8),&local_38);
  *(undefined8 **)this = puVar1;
  if (local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (__uniq_ptr_data<wabt::SelectExpr,_std::default_delete<wabt::SelectExpr>,_true,_true>)
         (__uniq_ptr_data<wabt::SelectExpr,_std::default_delete<wabt::SelectExpr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}